

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

void __thiscall ON_BezierCurve::ON_BezierCurve(ON_BezierCurve *this,int dim,bool is_rat,int order)

{
  this->m_cv = (double *)0x0;
  this->m_cv_capacity = 0;
  this->m_reserved_ON_BezierCurve = 0;
  this->m_dim = 0;
  this->m_is_rat = 0;
  this->m_order = 0;
  this->m_cv_stride = 0;
  Create(this,dim,is_rat,order);
  return;
}

Assistant:

ON_BezierCurve::ON_BezierCurve( int dim, bool is_rat, int order )
               : m_dim(0), 
                 m_is_rat(0), 
                 m_order(0), 
                 m_cv_stride(0), 
                 m_cv(0),
                 m_cv_capacity(0)
{
#if 8 == ON_SIZEOF_POINTER
  m_reserved_ON_BezierCurve = 0;
#endif
  Create(dim,is_rat,order);
}